

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fence.cpp
# Opt level: O2

void __thiscall myvk::Fence::~Fence(Fence *this)

{
  ~Fence(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Fence::~Fence() {
	if (m_fence)
		vkDestroyFence(m_device_ptr->GetHandle(), m_fence, nullptr);
}